

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg4.hpp
# Opt level: O0

basic_istream<wchar_t,_std::char_traits<wchar_t>_> *
trng::operator>>(basic_istream<wchar_t,_std::char_traits<wchar_t>_> *in,mrg4 *R)

{
  delim_c dVar1;
  delim_c dVar2;
  bool bVar3;
  fmtflags __fmtfl;
  _Ios_Fmtflags _Var4;
  basic_istream<wchar_t,_std::char_traits<wchar_t>_> *this;
  basic_istream<wchar_t,_std::char_traits<wchar_t>_> *d;
  delim_str in_00;
  int *in_RSI;
  basic_istream<wchar_t,_std::char_traits<wchar_t>_> *in_RDI;
  fmtflags flags;
  status_type S_new;
  parameter_type P_new;
  ignore_spaces_cl *in_stack_ffffffffffffff78;
  basic_istream<wchar_t,_std::char_traits<wchar_t>_> *in_stack_ffffffffffffffa0;
  undefined5 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbd;
  undefined1 in_stack_ffffffffffffffbe;
  mrg_status<int,_4,_trng::mrg4> local_30;
  mrg_parameter<int,_4,_trng::mrg4> local_20;
  int *local_10;
  basic_istream<wchar_t,_std::char_traits<wchar_t>_> *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  mrg_parameter<int,_4,_trng::mrg4>::mrg_parameter(&local_20);
  mrg_status<int,_4,_trng::mrg4>::mrg_status(&local_30);
  __fmtfl = Catch::clara::std::ios_base::flags
                      ((ios_base *)(local_8 + *(long *)(*(long *)local_8 + -0x18)));
  this = local_8 + *(long *)(*(long *)local_8 + -0x18);
  _Var4 = Catch::clara::std::operator|(_S_dec,_S_fixed);
  _Var4 = Catch::clara::std::operator|(_Var4,_S_left);
  Catch::clara::std::ios_base::flags((ios_base *)this,_Var4);
  utility::ignore_spaces();
  utility::operator>>(this,in_stack_ffffffffffffff78);
  utility::delim('\0');
  d = utility::operator>>(this,(delim_c *)in_stack_ffffffffffffff78);
  mrg4::name();
  in_00 = utility::delim((char *)in_stack_ffffffffffffff78);
  utility::operator>>(in_stack_ffffffffffffffa0,(delim_str *)d);
  dVar1 = utility::delim('\0');
  utility::operator>>(this,(delim_c *)in_stack_ffffffffffffff78);
  operator>>((basic_istream<wchar_t,_std::char_traits<wchar_t>_> *)in_00.str,
             (mrg_parameter<int,_4,_trng::mrg4> *)
             CONCAT17(dVar1.c,CONCAT16(in_stack_ffffffffffffffbe,
                                       CONCAT15(in_stack_ffffffffffffffbd,in_stack_ffffffffffffffb8)
                                      )));
  dVar2 = utility::delim('\0');
  utility::operator>>(this,(delim_c *)in_stack_ffffffffffffff78);
  operator>>((basic_istream<wchar_t,_std::char_traits<wchar_t>_> *)in_00.str,
             (mrg_status<int,_4,_trng::mrg4> *)
             CONCAT17(dVar1.c,CONCAT16(dVar2.c,CONCAT15(in_stack_ffffffffffffffbd,
                                                        in_stack_ffffffffffffffb8))));
  utility::delim('\0');
  utility::operator>>(this,(delim_c *)in_stack_ffffffffffffff78);
  bVar3 = std::wios::operator_cast_to_bool((wios *)(local_8 + *(long *)(*(long *)local_8 + -0x18)));
  if (bVar3) {
    *(undefined8 *)local_10 = local_20.a._0_8_;
    *(undefined8 *)(local_10 + 2) = local_20.a._8_8_;
    *(undefined8 *)(local_10 + 4) = local_30.r._0_8_;
    *(undefined8 *)(local_10 + 6) = local_30.r._8_8_;
  }
  Catch::clara::std::ios_base::flags
            ((ios_base *)(local_8 + *(long *)(*(long *)local_8 + -0x18)),__fmtfl);
  return local_8;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
        std::basic_istream<char_t, traits_t> &in, mrg4 &R) {
      mrg4::parameter_type P_new;
      mrg4::status_type S_new;
      std::ios_base::fmtflags flags(in.flags());
      in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
      in >> utility::ignore_spaces();
      in >> utility::delim('[') >> utility::delim(mrg4::name()) >> utility::delim(' ') >>
          P_new >> utility::delim(' ') >> S_new >> utility::delim(']');
      if (in) {
        R.P = P_new;
        R.S = S_new;
      }
      in.flags(flags);
      return in;
    }